

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2992::OutputRedirectTest_RestoreAndRead_Test::TestBody
          (OutputRedirectTest_RestoreAndRead_Test *this)

{
  bool bVar1;
  FILE *pFVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  OutputRedirect redir;
  buffered_file file;
  file write_end;
  file read_end;
  OutputRedirect *in_stack_00000eb8;
  buffered_file *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  char (*in_stack_fffffffffffffe88) [9];
  buffered_file *this_01;
  char *in_stack_fffffffffffffe90;
  OutputRedirect *this_02;
  char *in_stack_fffffffffffffe98;
  int line;
  char *in_stack_fffffffffffffea0;
  string *s;
  Type type;
  OutputRedirect *this_03;
  string local_130 [40];
  Message *in_stack_fffffffffffffef8;
  FILE *in_stack_ffffffffffffff00;
  string local_e8 [32];
  string local_c8 [32];
  AssertionResult local_a8 [2];
  string local_88 [32];
  string local_68 [32];
  AssertionResult local_48 [2];
  undefined1 local_28 [28];
  
  this_03 = (OutputRedirect *)&stack0xfffffffffffffff4;
  fmt::v5::file::file((file *)this_03);
  fmt::v5::file::file((file *)(local_28 + 0x18));
  fmt::v5::file::pipe((file *)this_03,(int *)(local_28 + 0x18));
  fmt::v5::file::fdopen((file *)local_28,(int)local_28 + 0x18,"w");
  s = (string *)local_28;
  pFVar2 = (FILE *)fmt::v5::buffered_file::get((buffered_file *)s);
  fprintf(pFVar2,"[[[");
  fmt::v5::buffered_file::get((buffered_file *)s);
  OutputRedirect::OutputRedirect(this_03,(FILE *)s);
  pFVar2 = (FILE *)fmt::v5::buffered_file::get((buffered_file *)local_28);
  fprintf(pFVar2,"censored");
  OutputRedirect::restore_and_read_abi_cxx11_(in_stack_00000eb8);
  sanitize(s);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_48);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    in_stack_fffffffffffffea0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x12081e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,(Type)((ulong)s >> 0x20),in_stack_fffffffffffffea0,
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x12087b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1208ec);
  OutputRedirect::restore_and_read_abi_cxx11_(in_stack_00000eb8);
  sanitize(s);
  type = (Type)((ulong)s >> 0x20);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             (char (*) [1])in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    in_stack_fffffffffffffe98 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1209ef);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,in_stack_fffffffffffffea0,
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x120a4c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x120abd);
  this_01 = (buffered_file *)local_28;
  pFVar2 = (FILE *)fmt::v5::buffered_file::get(this_01);
  fprintf(pFVar2,"]]]");
  this_02 = (OutputRedirect *)&stack0xffffffffffffff00;
  fmt::v5::buffered_file::buffered_file((buffered_file *)this_02);
  fmt::v5::buffered_file::operator=
            ((buffered_file *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  fmt::v5::buffered_file::~buffered_file((buffered_file *)this_02);
  read_abi_cxx11_((int)local_130,&stack0xfffffffffffffff4,6);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            (in_stack_fffffffffffffe98,(char *)this_02,(char (*) [7])this_01,
             in_stack_fffffffffffffe80);
  line = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  std::__cxx11::string::~string(local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_130 + 0x20));
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x120bdf)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,in_stack_fffffffffffffea0,line,(char *)this_02);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x120c2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x120c92);
  OutputRedirect::~OutputRedirect(this_02);
  fmt::v5::buffered_file::~buffered_file((buffered_file *)this_02);
  fmt::v5::file::~file((file *)this_02);
  fmt::v5::file::~file((file *)this_02);
  return;
}

Assistant:

TEST(OutputRedirectTest, RestoreAndRead) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  buffered_file file(write_end.fdopen("w"));
  std::fprintf(file.get(), "[[[");
  OutputRedirect redir(file.get());
  std::fprintf(file.get(), "censored");
  EXPECT_EQ("censored", sanitize(redir.restore_and_read()));
  EXPECT_EQ("", sanitize(redir.restore_and_read()));
  std::fprintf(file.get(), "]]]");
  file = buffered_file();
  EXPECT_READ(read_end, "[[[]]]");
}